

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O3

void __thiscall
cubeb_resampler_drift_drop_data_Test::TestBody(cubeb_resampler_drift_drop_data_Test *this)

{
  bool bVar1;
  uint uVar2;
  cubeb_resampler *resampler;
  float *array;
  ulong uVar3;
  long lVar4;
  float *pfVar5;
  stringstream *psVar6;
  AssertHelperData *this_00;
  ulong uVar7;
  int j;
  long lVar8;
  long lVar9;
  long lVar10;
  AssertHelper AVar11;
  char *pcVar12;
  byte bVar13;
  uint uVar14;
  int iVar15;
  int iVar17;
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  long frames;
  AssertionResult gtest_ar;
  long local_108;
  AssertHelper local_f8;
  long got;
  closure c;
  long BUF_BASE_SIZE;
  ulong local_d8;
  long prebuffer_frames;
  cubeb_stream_params input_params;
  vector<float,_std::allocator<float>_> input_buffer_normal;
  vector<float,_std::allocator<float>_> input_buffer_prebuffer;
  cubeb_stream_params output_params;
  AssertHelper local_50;
  vector<float,_std::allocator<float>_> input_buffer_glitch;
  
  lVar9 = 1;
  lVar10 = 4;
  do {
    c.input_channel_count = (int)lVar9;
    input_params.format = CUBEB_SAMPLE_FLOAT32LE;
    input_params.rate = 0xac44;
    output_params.channels = 2;
    output_params.format = CUBEB_SAMPLE_FLOAT32LE;
    output_params.rate = 0xac44;
    input_params.channels = c.input_channel_count;
    resampler = cubeb_resampler_create
                          ((cubeb_stream *)0x0,&input_params,&output_params,0xac44,
                           cb_passthrough_resampler_duplex,&c,CUBEB_RESAMPLER_QUALITY_VOIP,
                           CUBEB_RESAMPLER_RECLOCK_NONE);
    BUF_BASE_SIZE = 0x100;
    std::vector<float,_std::allocator<float>_>::vector
              (&input_buffer_prebuffer,lVar9 * 0x200,(allocator_type *)&input_buffer_glitch);
    std::vector<float,_std::allocator<float>_>::vector
              (&input_buffer_glitch,lVar9 * 0xa00,(allocator_type *)&input_buffer_normal);
    std::vector<float,_std::allocator<float>_>::vector
              (&input_buffer_normal,lVar9 << 8,(allocator_type *)&gtest_ar);
    array = (float *)operator_new(0x800);
    memset(array,0,0x800);
    uVar3 = (ulong)((long)input_buffer_prebuffer.super__Vector_base<float,_std::allocator<float>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)input_buffer_prebuffer.super__Vector_base<float,_std::allocator<float>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 2) /
            (ulong)input_params.channels;
    if (0 < (long)uVar3) {
      lVar4 = 0;
      uVar7 = 0;
      do {
        lVar8 = 0;
        do {
          input_buffer_prebuffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[(uint)((int)lVar4 + (int)lVar8)] = (float)(long)uVar7;
          lVar8 = lVar8 + 1;
        } while (lVar9 != lVar8);
        uVar7 = uVar7 + 1;
        lVar4 = lVar4 + lVar9;
      } while (uVar7 != uVar3);
    }
    prebuffer_frames = uVar3;
    got = cubeb_resampler_fill
                    (resampler,
                     input_buffer_prebuffer.super__Vector_base<float,_std::allocator<float>_>.
                     _M_impl.super__Vector_impl_data._M_start,&prebuffer_frames,array,0x100);
    testing::internal::CmpHelperEQ<long,long>
              ((internal *)&gtest_ar,"prebuffer_frames","BUF_BASE_SIZE",&prebuffer_frames,
               &BUF_BASE_SIZE);
    if (gtest_ar.success_ == false) {
      psVar6 = (stringstream *)operator_new(0x188);
      std::__cxx11::stringstream::stringstream(psVar6);
      *(undefined8 *)(psVar6 + *(long *)(*(long *)(psVar6 + 0x10) + -0x18) + 0x18) = 0x11;
      pcVar12 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar12 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      iVar15 = 0x359;
      frames = (long)psVar6;
LAB_0010a91c:
      testing::internal::AssertHelper::AssertHelper
                (&local_f8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_resampler.cpp"
                 ,iVar15,pcVar12);
      testing::internal::AssertHelper::operator=(&local_f8,(Message *)&frames);
      testing::internal::AssertHelper::~AssertHelper(&local_f8);
      if ((frames != 0) &&
         (bVar1 = testing::internal::IsTrue(true), AVar11.data_ = (AssertHelperData *)frames, bVar1)
         ) {
LAB_0010a955:
        if (AVar11.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)AVar11.data_ + 8))();
        }
      }
LAB_0010a9fe:
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      bVar13 = 1;
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperEQ<long,long>
                ((internal *)&gtest_ar,"got","BUF_BASE_SIZE",&got,&BUF_BASE_SIZE);
      if (gtest_ar.success_ == false) {
        psVar6 = (stringstream *)operator_new(0x188);
        std::__cxx11::stringstream::stringstream(psVar6);
        *(undefined8 *)(psVar6 + *(long *)(*(long *)(psVar6 + 0x10) + -0x18) + 0x18) = 0x11;
        pcVar12 = "";
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar12 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        iVar15 = 0x35a;
        frames = (long)psVar6;
        goto LAB_0010a91c;
      }
      uVar7 = 0;
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      lVar4 = lVar9 + -1;
      auVar16._8_4_ = (int)lVar4;
      auVar16._0_8_ = lVar4;
      auVar16._12_4_ = (int)((ulong)lVar4 >> 0x20);
      auVar16 = auVar16 ^ _DAT_00132060;
      iVar15 = auVar16._0_4_;
      auVar18._0_4_ = -(uint)(iVar15 == -0x80000000);
      auVar18._4_4_ = -(uint)(auVar16._4_4_ == -0x80000000);
      iVar17 = auVar16._8_4_;
      auVar18._8_4_ = -(uint)(iVar17 == -0x7fffffff);
      auVar18._12_4_ = -(uint)(auVar16._12_4_ == -0x80000000);
      auVar19._0_4_ = -(uint)(iVar15 < -0x80000000);
      auVar19._4_4_ = -(uint)(iVar15 < -0x80000000);
      auVar19._8_4_ = -(uint)(iVar17 < -0x7fffffff);
      auVar19._12_4_ = -(uint)(iVar17 < -0x7fffffff);
      uVar14 = movmskpd((int)&gtest_ar,auVar19 & auVar18);
      uVar14 = uVar14 ^ 3;
      bVar13 = (byte)uVar14;
      local_108 = 0x100;
      do {
        frames = 0x100;
        uVar2 = (uint)uVar7 + (((uint)uVar7 & 0xffff) / 100) * -100;
        local_d8 = uVar7;
        if ((short)uVar2 == 2) {
          pfVar5 = input_buffer_normal.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start + 1;
          lVar4 = 0;
          do {
            if ((uVar14 & 1) != 0) {
              pfVar5[-1] = (float)(long)(uVar3 + lVar4);
            }
            if (bVar13 >> 1 != 0) {
              *pfVar5 = (float)(long)(uVar3 + lVar4);
            }
            lVar4 = lVar4 + 1;
            pfVar5 = (float *)((long)pfVar5 + lVar10);
          } while (lVar4 != 0x100);
          uVar3 = uVar3 + 0x100;
          gtest_ar.success_ = false;
          gtest_ar._1_7_ = 1;
          got = cubeb_resampler_fill
                          (resampler,
                           input_buffer_normal.super__Vector_base<float,_std::allocator<float>_>.
                           _M_impl.super__Vector_impl_data._M_start,(long *)&gtest_ar,array,0x100);
          is_not_seq<float>(array,2,0x100,local_108);
          local_108 = (long)(array[0x1ff] + 1.0);
        }
        else {
          if ((uVar2 & 0xffff) == 1) {
            pfVar5 = input_buffer_glitch.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start + 1;
            lVar4 = 0;
            do {
              if ((uVar14 & 1) != 0) {
                pfVar5[-1] = (float)(long)(uVar3 + lVar4);
              }
              if (bVar13 >> 1 != 0) {
                *pfVar5 = (float)(long)(uVar3 + lVar4);
              }
              lVar4 = lVar4 + 1;
              pfVar5 = (float *)((long)pfVar5 + lVar10);
            } while (lVar4 != 0xa00);
            uVar3 = uVar3 + 0xa00;
            frames = 0xa00;
            got = cubeb_resampler_fill
                            (resampler,
                             input_buffer_glitch.super__Vector_base<float,_std::allocator<float>_>.
                             _M_impl.super__Vector_impl_data._M_start,&frames,array,0x100);
            is_seq<float>(array,2,0x100,local_108);
          }
          else {
            pfVar5 = input_buffer_normal.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start + 1;
            lVar4 = 0;
            do {
              if ((uVar14 & 1) != 0) {
                pfVar5[-1] = (float)(long)(uVar3 + lVar4);
              }
              if (bVar13 >> 1 != 0) {
                *pfVar5 = (float)(long)(uVar3 + lVar4);
              }
              lVar4 = lVar4 + 1;
              pfVar5 = (float *)((long)pfVar5 + lVar10);
            } while (lVar4 != 0x100);
            uVar3 = uVar3 + 0x100;
            gtest_ar.success_ = false;
            gtest_ar._1_7_ = 1;
            got = cubeb_resampler_fill
                            (resampler,
                             input_buffer_normal.super__Vector_base<float,_std::allocator<float>_>.
                             _M_impl.super__Vector_impl_data._M_start,(long *)&gtest_ar,array,0x100)
            ;
            is_seq<float>(array,2,0x100,local_108);
          }
          local_108 = local_108 + 0x100;
        }
        testing::internal::CmpHelperEQ<long,long>
                  ((internal *)&gtest_ar,"got","BUF_BASE_SIZE",&got,&BUF_BASE_SIZE);
        if (gtest_ar.success_ == false) {
          this_00 = (AssertHelperData *)operator_new(0x188);
          std::__cxx11::stringstream::stringstream((stringstream *)this_00);
          *(undefined8 *)
           ((long)&(this_00->message).c_str_ + *(long *)(*(long *)&this_00->line + -0x18)) = 0x11;
          pcVar12 = "";
          if (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar12 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          local_f8.data_ = this_00;
          testing::internal::AssertHelper::AssertHelper
                    (&local_50,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_resampler.cpp"
                     ,0x37a,pcVar12);
          testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_f8);
          testing::internal::AssertHelper::~AssertHelper(&local_50);
          if ((local_f8.data_ == (AssertHelperData *)0x0) ||
             (bVar1 = testing::internal::IsTrue(true), AVar11.data_ = local_f8.data_, !bVar1))
          goto LAB_0010a9fe;
          goto LAB_0010a955;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&gtest_ar.message_,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        uVar2 = (int)local_d8 + 1;
        uVar7 = (ulong)uVar2;
      } while (uVar2 != 300);
      cubeb_resampler_destroy(resampler);
      bVar13 = 0;
    }
    operator_delete(array);
    if (input_buffer_normal.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(input_buffer_normal.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (input_buffer_glitch.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(input_buffer_glitch.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (input_buffer_prebuffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(input_buffer_prebuffer.super__Vector_base<float,_std::allocator<float>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    lVar9 = lVar9 + 1;
    lVar10 = lVar10 + 4;
    if ((bool)(bVar13 | lVar9 == 3)) {
      return;
    }
  } while( true );
}

Assistant:

TEST(cubeb, resampler_drift_drop_data)
{
  for (uint32_t input_channels = 1; input_channels < 3; input_channels++) {
    cubeb_stream_params input_params;
    cubeb_stream_params output_params;

    const int output_channels = 2;
    const int sample_rate = 44100;

    input_params.channels = input_channels;
    input_params.rate = sample_rate;
    input_params.format = CUBEB_SAMPLE_FLOAT32NE;

    output_params.channels = output_channels;
    output_params.rate = sample_rate;
    output_params.format = CUBEB_SAMPLE_FLOAT32NE;

    int target_rate = input_params.rate;

    closure c;
    c.input_channel_count = input_channels;

    cubeb_resampler * resampler =
      cubeb_resampler_create((cubeb_stream*)nullptr, &input_params, &output_params,
        target_rate, cb_passthrough_resampler_duplex, &c,
        CUBEB_RESAMPLER_QUALITY_VOIP, CUBEB_RESAMPLER_RECLOCK_NONE);

    const long BUF_BASE_SIZE = 256;

    // The factor by which the deadline is missed. This is intentionally
    // kind of large to trigger the frame drop quickly. In real life, multiple
    // smaller under-runs would accumulate.
    const long UNDERRUN_FACTOR = 10;
    // Number buffer used for pre-buffering, that some backends do.
    const long PREBUFFER_FACTOR = 2;

    std::vector<float> input_buffer_prebuffer(input_channels * BUF_BASE_SIZE * PREBUFFER_FACTOR);
    std::vector<float> input_buffer_glitch(input_channels * BUF_BASE_SIZE * UNDERRUN_FACTOR);
    std::vector<float> input_buffer_normal(input_channels * BUF_BASE_SIZE);
    std::vector<float> output_buffer(output_channels * BUF_BASE_SIZE);

    long seq_idx = 0;
    long output_seq_idx = 0;

    long prebuffer_frames = input_buffer_prebuffer.size() / input_params.channels;
    seq_idx = seq(input_buffer_prebuffer.data(), input_channels, seq_idx,
      prebuffer_frames);

    long got = cubeb_resampler_fill(resampler, input_buffer_prebuffer.data(), &prebuffer_frames,
      output_buffer.data(), BUF_BASE_SIZE);

    output_seq_idx += BUF_BASE_SIZE;

    // prebuffer_frames will hold the frames used by the resampler.
    ASSERT_EQ(prebuffer_frames, BUF_BASE_SIZE);
    ASSERT_EQ(got, BUF_BASE_SIZE);

    for (uint32_t i = 0; i < 300; i++) {
      long int frames = BUF_BASE_SIZE;
      if (i != 0 && (i % 100) == 1) {
        // Once in a while, the output thread misses its deadline.
        // The input thread still produces data, so it ends up accumulating. Simulate this by providing a
        // much bigger input buffer. Check that the sequence is now unaligned, meaning we've dropped data
        // to keep everything in sync.
        seq_idx = seq(input_buffer_glitch.data(), input_channels, seq_idx, BUF_BASE_SIZE * UNDERRUN_FACTOR);
        frames = BUF_BASE_SIZE * UNDERRUN_FACTOR;
        got = cubeb_resampler_fill(resampler, input_buffer_glitch.data(), &frames, output_buffer.data(), BUF_BASE_SIZE);
        is_seq(output_buffer.data(), 2, BUF_BASE_SIZE, output_seq_idx);
        output_seq_idx += BUF_BASE_SIZE;
      }
      else if (i != 0 && (i % 100) == 2) {
        // On the next iteration, the sequence should be broken
        seq_idx = seq(input_buffer_normal.data(), input_channels, seq_idx, BUF_BASE_SIZE);
        long normal_input_frame_count = 256;
        got = cubeb_resampler_fill(resampler, input_buffer_normal.data(), &normal_input_frame_count, output_buffer.data(), BUF_BASE_SIZE);
        is_not_seq(output_buffer.data(), output_channels, BUF_BASE_SIZE, output_seq_idx);
        // Reclock so that we can use is_seq again.
        output_seq_idx = output_buffer[BUF_BASE_SIZE * output_channels - 1] + 1;
      }
      else {
        // normal case
        seq_idx = seq(input_buffer_normal.data(), input_channels, seq_idx, BUF_BASE_SIZE);
        long normal_input_frame_count = 256;
        got = cubeb_resampler_fill(resampler, input_buffer_normal.data(), &normal_input_frame_count, output_buffer.data(), BUF_BASE_SIZE);
        is_seq(output_buffer.data(), output_channels, BUF_BASE_SIZE, output_seq_idx);
        output_seq_idx += BUF_BASE_SIZE;
      }
      ASSERT_EQ(got, BUF_BASE_SIZE);
    }

    cubeb_resampler_destroy(resampler);
  }
}